

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Lms_Man_t * Lms_ManStart(Gia_Man_t *pGia,int nVars,int nCuts,int fFuncOnly,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Mem_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  word *pEntry;
  Gia_Man_t *p;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  Lms_Man_t *pLVar20;
  timespec ts;
  timespec local_70;
  long local_60;
  Lms_Man_t *local_58;
  Gia_Man_t *local_50;
  long local_48;
  Vec_Mem_t *local_40;
  Vec_Int_t *local_38;
  
  local_60 = CONCAT44(local_60._4_4_,fFuncOnly);
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (pGia != (Gia_Man_t *)0x0) {
    nVars = pGia->vCis->nSize;
  }
  if (10 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= LMS_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x137,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
  }
  local_58 = (Lms_Man_t *)calloc(1,0x40d8);
  local_58->nVars = nVars;
  local_58->nCuts = nCuts;
  iVar3 = 1 << ((byte)(nVars - 6U) & 0x1f);
  if ((uint)nVars < 7) {
    iVar3 = 1;
  }
  local_58->nWords = iVar3;
  local_58->fFuncOnly = (int)local_60;
  pVVar7 = (Vec_Mem_t *)calloc(1,0x30);
  pVVar7->nEntrySize = iVar3;
  pVVar7->LogPageSze = 0xc;
  pVVar7->PageMask = 0xfff;
  pVVar7->iPage = -1;
  local_58->vTtMem = pVVar7;
  uVar18 = 9999;
  while( true ) {
    do {
      uVar17 = uVar18;
      uVar18 = uVar17 + 1;
    } while ((uVar17 & 1) != 0);
    if (uVar18 < 9) break;
    iVar3 = 5;
    while (uVar18 % (iVar3 - 2U) != 0) {
      uVar4 = iVar3 * iVar3;
      iVar3 = iVar3 + 2;
      if (uVar18 < uVar4) goto LAB_00287f71;
    }
  }
LAB_00287f71:
  local_50 = pGia;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar17) {
    uVar4 = uVar18;
  }
  pVVar8->nCap = uVar4;
  piVar9 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar18;
  memset(piVar9,0xff,(long)(int)uVar18 << 2);
  pVVar7->vTable = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 10000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(40000);
  pLVar20 = local_58;
  pVVar8->pArray = piVar9;
  pVVar7->vNexts = pVVar8;
  if ((int)local_60 == 0) {
    local_48 = lVar14;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 10000;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(40000);
    pVVar8->pArray = piVar9;
    pLVar20->vTruthIds = pVVar8;
    local_38 = pVVar8;
    if (local_50 == (Gia_Man_t *)0x0) {
      p = Gia_ManStart(10000);
      pLVar20->pGia = p;
      pcVar10 = (char *)malloc(7);
      builtin_strncpy(pcVar10,"record",7);
      p->pName = pcVar10;
      if (0 < nVars) {
        do {
          pGVar11 = Gia_ManAppendObj(p);
          uVar2 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar2 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar2 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar1 = p->pObjs;
          if ((pGVar11 < pGVar1) || (pGVar1 + p->nObjs <= pGVar11)) {
LAB_002883e7:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar1) >> 2) * -0x55555555);
          if ((pGVar11 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar11)) goto LAB_002883e7;
          nVars = nVars - 1;
        } while (nVars != 0);
      }
    }
    else {
      pLVar20->pGia = local_50;
      pVVar8 = local_50->vCos;
      iVar3 = pVVar8->nSize;
      pLVar20->nAdded = iVar3;
      local_40 = pVVar7;
      if (0 < iVar3) {
        lVar19 = 0;
        local_60 = 0;
        lVar14 = 0;
        iVar3 = -1;
        do {
          iVar6 = pVVar8->pArray[lVar14];
          if (((long)iVar6 < 0) || (local_50->nObjs <= iVar6)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar1 = local_50->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          iVar5 = clock_gettime(3,&local_70);
          if (iVar5 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          pEntry = Gia_ObjComputeTruthTable(local_50,pGVar1 + iVar6);
          iVar6 = clock_gettime(3,&local_70);
          pLVar20 = local_58;
          if (iVar6 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          local_60 = local_60 + lVar16 + lVar15;
          local_58->timeTruth = local_60;
          iVar6 = clock_gettime(3,&local_70);
          if (iVar6 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          iVar6 = Vec_MemHashInsert(local_40,pEntry);
          iVar5 = clock_gettime(3,&local_70);
          if (iVar5 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          lVar19 = lVar19 + lVar16 + lVar15;
          pLVar20->timeInsert = lVar19;
          if (iVar6 != iVar3 + 1 && iVar6 != iVar3) {
            __assert_fail("Index == Prev || Index == Prev + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                          ,0x15f,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
          }
          Vec_IntPush(local_38,iVar6);
          lVar14 = lVar14 + 1;
          pVVar8 = local_50->vCos;
          iVar3 = iVar6;
        } while (lVar14 < pVVar8->nSize);
      }
    }
    pVVar12 = (Vec_Ptr_t *)malloc(0x10);
    pVVar12->nCap = 1000;
    pVVar12->nSize = 0;
    ppvVar13 = (void **)malloc(8000);
    pLVar20 = local_58;
    pVVar12->pArray = ppvVar13;
    local_58->vNodes = pVVar12;
    pVVar12 = (Vec_Ptr_t *)malloc(0x10);
    pVVar12->nCap = 1000;
    pVVar12->nSize = 0;
    ppvVar13 = (void **)malloc(8000);
    pVVar12->pArray = ppvVar13;
    pLVar20->vLabelsP = pVVar12;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(4000);
    pVVar8->pArray = piVar9;
    pLVar20->vLabels = pVVar8;
    iVar3 = clock_gettime(3,&local_70);
    if (iVar3 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    pLVar20->timeTotal = lVar14 + local_48;
  }
  return pLVar20;
}

Assistant:

Lms_Man_t * Lms_ManStart( Gia_Man_t * pGia, int nVars, int nCuts, int fFuncOnly, int fVerbose )
{
    Lms_Man_t * p;
    abctime clk, clk2 = Abc_Clock();
    // if GIA is given, use the number of variables from GIA
    nVars = pGia ? Gia_ManCiNum(pGia) : nVars;
    assert( nVars >= 6 && nVars <= LMS_VAR_MAX );
    // allocate manager
    p = ABC_CALLOC( Lms_Man_t, 1 );
    // parameters
    p->nVars = nVars;
    p->nCuts = nCuts;
    p->nWords = Abc_Truth6WordNum( nVars );
    p->fFuncOnly = fFuncOnly;
    // internal data for library construction
    p->vTtMem = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
//    p->vTtMem2 = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
    Vec_MemHashAlloc( p->vTtMem, 10000 );
//    Vec_MemHashAlloc( p->vTtMem2, 10000 );
    if ( fFuncOnly )
        return p;    
    p->vTruthIds = Vec_IntAlloc( 10000 );
    if ( pGia == NULL )
    {
        int i;
        p->pGia = Gia_ManStart( 10000 );
        p->pGia->pName = Abc_UtilStrsav( "record" );
        for ( i = 0; i < nVars; i++ )
            Gia_ManAppendCi( p->pGia );
    }
    else
    {
        Gia_Obj_t * pObj;
        word * pTruth;
        int i, Index, Prev = -1;
        p->pGia = pGia;
        // populate the manager with subgraphs present in GIA
        p->nAdded = Gia_ManCoNum( p->pGia );
        Gia_ManForEachCo( p->pGia, pObj, i )
        {
            clk = Abc_Clock();
            pTruth = Gia_ObjComputeTruthTable( p->pGia, pObj );
            p->timeTruth += Abc_Clock() - clk;
            clk = Abc_Clock();
            Index = Vec_MemHashInsert( p->vTtMem, pTruth );
            p->timeInsert += Abc_Clock() - clk;
            assert( Index == Prev || Index == Prev + 1 ); // GIA subgraphs should be ordered
            Vec_IntPush( p->vTruthIds, Index );
            Prev = Index;
        }
    }
    // temporaries
    p->vNodes    = Vec_PtrAlloc( 1000 );
    p->vLabelsP  = Vec_PtrAlloc( 1000 );
    p->vLabels   = Vec_IntAlloc( 1000 );
p->timeTotal += Abc_Clock() - clk2;
    return p;    
}